

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

void __thiscall
mjs::interpreter::impl::check_strict_mode_put(impl *this,object_ptr *o,wstring_view p)

{
  bool bVar1;
  property_attribute a;
  long *plVar2;
  wostream *pwVar3;
  native_error_exception *pnVar4;
  void *pvVar5;
  wstring_view *s;
  wstring_view *s_00;
  wstring_view *s_01;
  wstring local_200;
  wstring_view local_1e0;
  wchar_t *local_1d0;
  size_t local_1c8;
  wstring_view p_local;
  wstring_view local_1a0;
  wostringstream woss;
  
  p_local._M_str = p._M_str;
  p_local._M_len = p._M_len;
  if ((o->super_gc_heap_ptr_untyped).heap_ == (gc_heap *)0x0) {
    std::__cxx11::wostringstream::wostringstream((wostringstream *)&woss);
    cpp_quote_abi_cxx11_(&local_200,(mjs *)&p_local,s_00);
    pwVar3 = std::operator<<((wostream *)&woss,(wstring *)&local_200);
    std::operator<<(pwVar3," is not defined");
    std::__cxx11::wstring::~wstring((wstring *)&local_200);
    pnVar4 = (native_error_exception *)__cxa_allocate_exception(0x58);
    stack_trace_abi_cxx11_(&local_200,this);
    local_1e0._M_len = local_200._M_string_length;
    local_1e0._M_str = local_200._M_dataplus._M_p;
    std::__cxx11::wstringbuf::str();
    local_1a0._M_len = local_1c8;
    local_1a0._M_str = local_1d0;
    native_error_exception::native_error_exception(pnVar4,reference,&local_1e0,&local_1a0);
    __cxa_throw(pnVar4,&native_error_exception::typeinfo,
                native_error_exception::~native_error_exception);
  }
  plVar2 = (long *)gc_heap_ptr_untyped::get(&o->super_gc_heap_ptr_untyped);
  a = (**(code **)(*plVar2 + 0x30))(plVar2,&p_local);
  bVar1 = is_valid(a);
  if (bVar1) {
    bVar1 = has_attributes(a,read_only);
    if (bVar1) {
      std::__cxx11::wostringstream::wostringstream((wostringstream *)&woss);
      pwVar3 = std::operator<<((wostream *)&woss,"Cannot assign to read only property ");
      cpp_quote_abi_cxx11_(&local_200,(mjs *)&p_local,s);
      pwVar3 = std::operator<<(pwVar3,(wstring *)&local_200);
      std::operator<<(pwVar3," in strict mode");
      std::__cxx11::wstring::~wstring((wstring *)&local_200);
      pnVar4 = (native_error_exception *)__cxa_allocate_exception(0x58);
      stack_trace_abi_cxx11_(&local_200,this);
      local_1e0._M_len = local_200._M_string_length;
      local_1e0._M_str = local_200._M_dataplus._M_p;
      std::__cxx11::wstringbuf::str();
      local_1a0._M_len = local_1c8;
      local_1a0._M_str = local_1d0;
      native_error_exception::native_error_exception(pnVar4,type,&local_1e0,&local_1a0);
      __cxa_throw(pnVar4,&native_error_exception::typeinfo,
                  native_error_exception::~native_error_exception);
    }
  }
  else {
    pvVar5 = gc_heap_ptr_untyped::get(&o->super_gc_heap_ptr_untyped);
    if (*(char *)((long)pvVar5 + 0x1c) == '\0') {
      std::__cxx11::wostringstream::wostringstream((wostringstream *)&woss);
      pwVar3 = std::operator<<((wostream *)&woss,"Cannot add property ");
      cpp_quote_abi_cxx11_(&local_200,(mjs *)&p_local,s_01);
      pwVar3 = std::operator<<(pwVar3,(wstring *)&local_200);
      std::operator<<(pwVar3," to non-extensible object in strict mode");
      std::__cxx11::wstring::~wstring((wstring *)&local_200);
      pnVar4 = (native_error_exception *)__cxa_allocate_exception(0x58);
      stack_trace_abi_cxx11_(&local_200,this);
      local_1e0._M_len = local_200._M_string_length;
      local_1e0._M_str = local_200._M_dataplus._M_p;
      std::__cxx11::wstringbuf::str();
      local_1a0._M_len = local_1c8;
      local_1a0._M_str = local_1d0;
      native_error_exception::native_error_exception(pnVar4,type,&local_1e0,&local_1a0);
      __cxa_throw(pnVar4,&native_error_exception::typeinfo,
                  native_error_exception::~native_error_exception);
    }
  }
  return;
}

Assistant:

void check_strict_mode_put(const object_ptr& o, const std::wstring_view p) const {
        if (!o) {
            std::wostringstream woss;
            woss << cpp_quote(p) << " is not defined";
            throw native_error_exception{native_error_type::reference, stack_trace(), woss.str()};
        }

        // ES5.1, 11.13.1
        if (const auto a = o->own_property_attributes(p); is_valid(a)) {
            if (!has_attributes(a, property_attribute::read_only)) {
                // OK property is writable
                return;
            }
            std::wostringstream woss;
            woss << "Cannot assign to read only property " << cpp_quote(p) << " in strict mode";
            throw native_error_exception{native_error_type::type, stack_trace(), woss.str()};
        }

        if (o->is_extensible()) {
            // OK property doesn't exist, but object is extensible
            return;
        }

        std::wostringstream woss;
        woss << "Cannot add property " << cpp_quote(p) << " to non-extensible object in strict mode";
        throw native_error_exception{native_error_type::type, stack_trace(), woss.str()};
    }